

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O1

void __thiscall
btMultiBodyPoint2Point::createConstraintRows
          (btMultiBodyPoint2Point *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  btMultiBodySolverConstraint *solverConstraint;
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  btScalar upperLimit;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  btRigidBody *pbVar8;
  btMultiBody *pbVar9;
  long lVar10;
  void *pvVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  btVector3 bVar15;
  btVector3 local_88;
  btVector3 local_78;
  btVector3 local_68;
  btVector3 *local_58;
  btVector3 *local_50;
  btMultiBodyJacobianData *local_48;
  btContactSolverInfo *local_40;
  long local_38;
  
  local_50 = &this->m_pivotInA;
  local_58 = &this->m_pivotInB;
  local_38 = 0;
  local_48 = data;
  local_40 = infoGlobal;
  do {
    iVar6 = *(int *)(constraintRows + 4);
    if (iVar6 == *(int *)(constraintRows + 8)) {
      iVar13 = iVar6 * 2;
      if (iVar6 == 0) {
        iVar13 = 1;
      }
      if (*(int *)(constraintRows + 8) < iVar13) {
        if (iVar13 == 0) {
          pvVar11 = (void *)0x0;
        }
        else {
          pvVar11 = btAlignedAllocInternal((long)iVar13 * 0xe0,0x10);
        }
        iVar7 = *(int *)(constraintRows + 4);
        if (0 < (long)iVar7) {
          lVar14 = 0;
          do {
            memcpy((void *)((long)pvVar11 + lVar14),
                   (void *)(*(long *)(constraintRows + 0x10) + lVar14),0xe0);
            lVar14 = lVar14 + 0xe0;
          } while ((long)iVar7 * 0xe0 - lVar14 != 0);
        }
        infoGlobal = local_40;
        data = local_48;
        if (*(void **)(constraintRows + 0x10) != (void *)0x0) {
          if (constraintRows[0x18] == (btMultiBodyConstraintArray)0x1) {
            btAlignedFreeInternal(*(void **)(constraintRows + 0x10));
          }
          *(undefined8 *)(constraintRows + 0x10) = 0;
        }
        constraintRows[0x18] = (btMultiBodyConstraintArray)0x1;
        *(void **)(constraintRows + 0x10) = pvVar11;
        *(int *)(constraintRows + 8) = iVar13;
      }
    }
    lVar10 = local_38;
    *(int *)(constraintRows + 4) = *(int *)(constraintRows + 4) + 1;
    lVar14 = *(long *)(constraintRows + 0x10);
    lVar12 = (long)iVar6 * 0xe0;
    solverConstraint = (btMultiBodySolverConstraint *)(lVar14 + lVar12);
    *(btMultiBodyPoint2Point **)(lVar14 + 0xd0 + lVar12) = this;
    *(int *)(lVar14 + 0xd8 + lVar12) = (int)local_38;
    puVar1 = (undefined8 *)(lVar14 + 0x10 + lVar12);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar14 + 0x20 + lVar12);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar14 + 0x30 + lVar12);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar14 + 0x40 + lVar12);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar14 + 0x50 + lVar12);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar14 + 0x60 + lVar12);
    *puVar1 = 0;
    puVar1[1] = 0;
    iVar6 = data->m_fixedBodyId;
    *(int *)(lVar14 + 0xa8 + lVar12) = iVar6;
    *(int *)(lVar14 + 0xbc + lVar12) = iVar6;
    local_68.m_floats[0] = 0.0;
    local_68.m_floats[1] = 0.0;
    local_68.m_floats[2] = 0.0;
    local_68.m_floats[3] = 0.0;
    local_68.m_floats[local_38] = -1.0;
    local_78.m_floats._0_8_ = *(undefined8 *)local_50->m_floats;
    local_78.m_floats._8_8_ = *(undefined8 *)(local_50->m_floats + 2);
    pbVar8 = this->m_rigidBodyA;
    if (pbVar8 == (btRigidBody *)0x0) {
      pbVar9 = (this->super_btMultiBodyConstraint).m_bodyA;
      if (pbVar9 != (btMultiBody *)0x0) {
        bVar15 = btMultiBody::localPosToWorld
                           (pbVar9,(this->super_btMultiBodyConstraint).m_linkA,local_50);
        local_78.m_floats[0] = bVar15.m_floats[0];
        local_78.m_floats[1] = bVar15.m_floats[1];
        local_78.m_floats[2] = bVar15.m_floats[2];
        local_78.m_floats[3] = bVar15.m_floats[3];
        goto LAB_001cedbb;
      }
    }
    else {
      solverConstraint->m_solverBodyIdA = (pbVar8->super_btCollisionObject).m_companionId;
      fVar2 = (this->m_pivotInA).m_floats[0];
      fVar3 = (this->m_pivotInA).m_floats[1];
      fVar4 = (this->m_pivotInA).m_floats[2];
      uVar5 = *(undefined8 *)(pbVar8->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
      local_78.m_floats[0] =
           (float)uVar5 +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] * fVar4 +
           fVar2 * (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1] * fVar3;
      local_78.m_floats[1] =
           (float)((ulong)uVar5 >> 0x20) +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] * fVar4 +
           fVar2 * (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1] * fVar3;
      local_78.m_floats[2] =
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] * fVar4 +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] * fVar2 +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1] * fVar3 +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      local_78.m_floats[3] = 0.0;
LAB_001cedbb:
    }
    local_88.m_floats._0_8_ = *(undefined8 *)local_58->m_floats;
    local_88.m_floats._8_8_ = *(undefined8 *)(local_58->m_floats + 2);
    pbVar8 = this->m_rigidBodyB;
    if (pbVar8 == (btRigidBody *)0x0) {
      pbVar9 = (this->super_btMultiBodyConstraint).m_bodyB;
      if (pbVar9 != (btMultiBody *)0x0) {
        bVar15 = btMultiBody::localPosToWorld
                           (pbVar9,(this->super_btMultiBodyConstraint).m_linkB,local_58);
        local_88.m_floats[0] = bVar15.m_floats[0];
        local_88.m_floats[1] = bVar15.m_floats[1];
        local_88.m_floats[2] = bVar15.m_floats[2];
        local_88.m_floats[3] = bVar15.m_floats[3];
        goto LAB_001cee9e;
      }
    }
    else {
      solverConstraint->m_solverBodyIdB = (pbVar8->super_btCollisionObject).m_companionId;
      fVar2 = (this->m_pivotInB).m_floats[0];
      fVar3 = (this->m_pivotInB).m_floats[1];
      fVar4 = (this->m_pivotInB).m_floats[2];
      uVar5 = *(undefined8 *)(pbVar8->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
      local_88.m_floats[0] =
           (float)uVar5 +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] * fVar4 +
           fVar2 * (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1] * fVar3;
      local_88.m_floats[1] =
           (float)((ulong)uVar5 >> 0x20) +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] * fVar4 +
           fVar2 * (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1] * fVar3;
      local_88.m_floats[2] =
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] * fVar4 +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] * fVar2 +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1] * fVar3 +
           (pbVar8->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      local_88.m_floats[3] = 0.0;
LAB_001cee9e:
    }
    upperLimit = (this->super_btMultiBodyConstraint).m_maxAppliedImpulse;
    btMultiBodyConstraint::fillMultiBodyConstraint
              (&this->super_btMultiBodyConstraint,solverConstraint,data,(btScalar *)0x0,
               (btScalar *)0x0,&local_68,&local_78,&local_88,
               (local_78.m_floats[2] - local_88.m_floats[2]) * local_68.m_floats[2] +
               (local_78.m_floats[0] - local_88.m_floats[0]) * local_68.m_floats[0] +
               (local_78.m_floats[1] - local_88.m_floats[1]) * local_68.m_floats[1],infoGlobal,
               -upperLimit,upperLimit,1.0,false,0.0,0.0);
    local_38 = lVar10 + 1;
    if (local_38 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void btMultiBodyPoint2Point::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{

//	int i=1;
int numDim = BTMBP2PCONSTRAINT_DIM;
	for (int i=0;i<numDim;i++)
	{

		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();
        //memset(&constraintRow,0xffffffff,sizeof(btMultiBodySolverConstraint));
	constraintRow.m_orgConstraint = this;
	constraintRow.m_orgDofIndex = i;
        constraintRow.m_relpos1CrossNormal.setValue(0,0,0);
        constraintRow.m_contactNormal1.setValue(0,0,0);
        constraintRow.m_relpos2CrossNormal.setValue(0,0,0);
        constraintRow.m_contactNormal2.setValue(0,0,0);
        constraintRow.m_angularComponentA.setValue(0,0,0);
        constraintRow.m_angularComponentB.setValue(0,0,0);

		constraintRow.m_solverBodyIdA = data.m_fixedBodyId;
		constraintRow.m_solverBodyIdB = data.m_fixedBodyId;

		btVector3 contactNormalOnB(0,0,0);
#ifndef BTMBP2PCONSTRAINT_BLOCK_ANGULAR_MOTION_TEST
		contactNormalOnB[i] = -1;
#else
		contactNormalOnB[i%3] = -1;
#endif


		 // Convert local points back to world
		btVector3 pivotAworld = m_pivotInA;
		if (m_rigidBodyA)
		{

			constraintRow.m_solverBodyIdA = m_rigidBodyA->getCompanionId();
			pivotAworld = m_rigidBodyA->getCenterOfMassTransform()*m_pivotInA;
		} else
		{
			if (m_bodyA)
				pivotAworld = m_bodyA->localPosToWorld(m_linkA, m_pivotInA);
		}
		btVector3 pivotBworld = m_pivotInB;
		if (m_rigidBodyB)
		{
			constraintRow.m_solverBodyIdB = m_rigidBodyB->getCompanionId();
			pivotBworld = m_rigidBodyB->getCenterOfMassTransform()*m_pivotInB;
		} else
		{
			if (m_bodyB)
				pivotBworld = m_bodyB->localPosToWorld(m_linkB, m_pivotInB);

		}

		btScalar posError = i < 3 ? (pivotAworld-pivotBworld).dot(contactNormalOnB) : 0;

#ifndef BTMBP2PCONSTRAINT_BLOCK_ANGULAR_MOTION_TEST


		fillMultiBodyConstraint(constraintRow, data, 0, 0,
															contactNormalOnB, pivotAworld, pivotBworld,						//sucks but let it be this way "for the time being"
															posError,
															infoGlobal,
															-m_maxAppliedImpulse, m_maxAppliedImpulse
															);
    //@todo: support the case of btMultiBody versus btRigidBody,
    //see btPoint2PointConstraint::getInfo2NonVirtual
#else
		const btVector3 dummy(0, 0, 0);

		btAssert(m_bodyA->isMultiDof());

		btScalar* jac1 = jacobianA(i);
		const btVector3 &normalAng = i >= 3 ? contactNormalOnB : dummy;
		const btVector3 &normalLin = i < 3 ? contactNormalOnB : dummy;

		m_bodyA->filConstraintJacobianMultiDof(m_linkA, pivotAworld, normalAng, normalLin, jac1, data.scratch_r, data.scratch_v, data.scratch_m);

		fillMultiBodyConstraint(constraintRow, data, jac1, 0,
													dummy, dummy, dummy,						//sucks but let it be this way "for the time being"
													posError,
													infoGlobal,
													-m_maxAppliedImpulse, m_maxAppliedImpulse
													);
#endif
	}
}